

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O1

State __thiscall TileWire::checkOutput(TileWire *this,Direction direction)

{
  long lVar1;
  State SVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)(int)(this->super_Tile)._direction;
  lVar4 = (long)(int)this->_type * 0x10;
  if (((((&(&this->super_Tile)[lVar3 * 2].field_0x21)[(long)(int)direction * 4 + lVar4] != '\0') ||
       (lVar1 = (long)(int)direction * 4,
       (&(&this->super_Tile)[lVar3 * 2].field_0x22)[lVar1 + lVar4] != '\0')) ||
      ((&(&this->super_Tile)[lVar3 * 2].field_0x23)[lVar1 + lVar4] != '\0')) ||
     (SVar2 = DISCONNECTED, (&(&this->super_Tile)[lVar3 * 2].field_0x24)[lVar1 + lVar4] == '\x01'))
  {
    if ((direction & 0x80000001) == EAST && this->_type == CROSSOVER) {
      return this->_state2;
    }
    SVar2 = this->_state1;
  }
  return SVar2;
}

Assistant:

State TileWire::checkOutput(Direction direction) const {
    const bool* exitDirections = CONNECTION_INFO[_direction][_type][direction];
    if (exitDirections[0] || exitDirections[1] || exitDirections[2] || exitDirections[3]) {
        if (_type == CROSSOVER && direction % 2 == 1) {
            return _state2;
        } else {
            return _state1;
        }
    } else {
        return DISCONNECTED;
    }
}